

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O3

void resizeDeepBuffers<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
               *channels)

{
  _List_node_base *p_Var1;
  long lVar2;
  void *pvVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  for (p_Var1 = (channels->
                super__List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)channels;
      p_Var1 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    p_Var4 = p_Var1[1]._M_next;
    if (0 < (long)p_Var4) {
      lVar2 = sampleCount->_sizeY;
      p_Var5 = p_Var1[1]._M_prev;
      lVar11 = 0;
      lVar8 = 0;
      lVar7 = 0;
      p_Var6 = p_Var5;
      do {
        if (0 < (long)p_Var6) {
          lVar10 = 0;
          do {
            uVar9 = (ulong)*(uint *)((long)sampleCount->_data + lVar10 * 4 + lVar11);
            if (uVar9 == 0) {
              pvVar3 = (void *)0x0;
            }
            else {
              pvVar3 = operator_new__(uVar9 * 2);
              p_Var5 = p_Var1[1]._M_prev;
              p_Var6 = p_Var5;
            }
            *(void **)(*(long *)(p_Var1 + 1 + 1) + lVar10 * 8 + (long)p_Var6 * lVar8) = pvVar3;
            lVar10 = lVar10 + 1;
            p_Var6 = p_Var5;
          } while (lVar10 < (long)p_Var5);
          p_Var4 = p_Var1[1]._M_next;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 8;
        lVar11 = lVar11 + lVar2 * 4;
      } while (lVar7 < (long)p_Var4);
    }
  }
  return;
}

Assistant:

void
resizeDeepBuffers (Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels)
{
    //
    // Allocate memory for samples in all pixel buffers according to the data in sampleCount buffer.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                if (count)
                    channel[y][x]  = new T[count];
                else
                    channel[y][x]  = nullptr;
            }
        }
    }
}